

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_palette_add(LodePNGColorMode *info,uchar r,uchar g,uchar b,uchar a)

{
  uint uVar1;
  
  if ((info->palette == (uchar *)0x0) &&
     (lodepng_color_mode_alloc_palette(info), info->palette == (uchar *)0x0)) {
    return 0x53;
  }
  uVar1 = 0x6c;
  if (info->palettesize < 0x100) {
    info->palette[info->palettesize * 4] = r;
    info->palette[info->palettesize * 4 + 1] = g;
    info->palette[info->palettesize * 4 + 2] = b;
    info->palette[info->palettesize * 4 + 3] = a;
    info->palettesize = info->palettesize + 1;
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

unsigned lodepng_palette_add(LodePNGColorMode* info,
                             unsigned char r, unsigned char g, unsigned char b, unsigned char a) {
  if(!info->palette) /*allocate palette if empty*/ {
    lodepng_color_mode_alloc_palette(info);
    if(!info->palette) return 83; /*alloc fail*/
  }
  if(info->palettesize >= 256) {
    return 108; /*too many palette values*/
  }
  info->palette[4 * info->palettesize + 0] = r;
  info->palette[4 * info->palettesize + 1] = g;
  info->palette[4 * info->palettesize + 2] = b;
  info->palette[4 * info->palettesize + 3] = a;
  ++info->palettesize;
  return 0;
}